

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void SendSetup(DWORD *playersdetected,BYTE *gotsetup,int len)

{
  SWORD SVar1;
  int len_00;
  long lVar2;
  
  if (consoleplayer == Net_Arbitrator) {
    SVar1 = doomcom.numnodes;
    for (lVar2 = 1; lVar2 < SVar1; lVar2 = lVar2 + 1) {
      if ((gotsetup[lVar2] == '\0') || (doomcom.data[0] == '#')) {
        HSendPacket((int)lVar2,len);
        SVar1 = doomcom.numnodes;
      }
    }
    return;
  }
  len_00 = 10;
  if ((playersdetected[1] >> (consoleplayer & 0x1fU) & 1) == 0) {
    len_00 = len;
  }
  HSendPacket(1,len_00);
  return;
}

Assistant:

static void SendSetup (DWORD playersdetected[MAXNETNODES], BYTE gotsetup[MAXNETNODES], int len)
{
	if (consoleplayer != Net_Arbitrator)
	{
		if (playersdetected[1] & (1 << consoleplayer))
		{
			HSendPacket (1, 10);
		}
		else
		{
			HSendPacket (1, len);
		}
	}
	else
	{
		for (int i = 1; i < doomcom.numnodes; ++i)
		{
			if (!gotsetup[i] || netbuffer[0] == NCMD_SETUP+3)
			{
				HSendPacket (i, len);
			}
		}
	}
}